

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O2

void bench_ellswift_decode(void *arg,int iters)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 uStack_80;
  size_t len;
  secp256k1_pubkey out;
  
  uVar2 = 0;
  if (iters < 1) {
    iters = 0;
  }
  while( true ) {
    if (iters == uVar2) {
      return;
    }
    iVar1 = secp256k1_ellswift_decode(*arg,&out,(long)arg + 0x4008);
    if (iVar1 != 1) break;
    len = 0x21;
    iVar1 = secp256k1_ec_pubkey_serialize
                      (*arg,(ulong)(uVar2 & 0x1f) + (long)arg + 0x4008,&len,&out,0x102);
    uVar2 = uVar2 + 1;
    if (iVar1 == 0) {
      pcVar3 = 
      "test condition failed: secp256k1_ec_pubkey_serialize(data->ctx, data->rnd64 + (i % 32), &len, &out, SECP256K1_EC_COMPRESSED)"
      ;
      uStack_80 = 0x46;
LAB_001028d4:
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ellswift/bench_impl.h"
              ,uStack_80,pcVar3);
      abort();
    }
  }
  pcVar3 = "test condition failed: secp256k1_ellswift_decode(data->ctx, &out, data->rnd64) == 1";
  uStack_80 = 0x44;
  goto LAB_001028d4;
}

Assistant:

static void bench_ellswift_decode(void *arg, int iters) {
    int i;
    secp256k1_pubkey out;
    size_t len;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        CHECK(secp256k1_ellswift_decode(data->ctx, &out, data->rnd64) == 1);
        len = 33;
        CHECK(secp256k1_ec_pubkey_serialize(data->ctx, data->rnd64 + (i % 32), &len, &out, SECP256K1_EC_COMPRESSED));
    }
}